

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t slist_size(curl_slist *s,size_t overhead,char *skip,size_t skiplen)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 local_30;
  size_t size;
  size_t skiplen_local;
  char *skip_local;
  size_t overhead_local;
  curl_slist *s_local;
  
  local_30 = 0;
  overhead_local = (size_t)s;
  do {
    if (overhead_local == 0) {
      return local_30;
    }
    if (skip == (char *)0x0) {
LAB_00163195:
      sVar2 = strlen(*(char **)overhead_local);
      local_30 = sVar2 + overhead + local_30;
    }
    else {
      pcVar1 = match_header((curl_slist *)overhead_local,skip,skiplen);
      if (pcVar1 == (char *)0x0) goto LAB_00163195;
    }
    overhead_local = *(size_t *)(overhead_local + 8);
  } while( true );
}

Assistant:

static size_t slist_size(struct curl_slist *s,
                         size_t overhead, const char *skip, size_t skiplen)
{
  size_t size = 0;

  for(; s; s = s->next)
    if(!skip || !match_header(s, skip, skiplen))
      size += strlen(s->data) + overhead;
  return size;
}